

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsocks5socketengine.cpp
# Opt level: O0

void __thiscall
QSocks5SocketEnginePrivate::emitConnectionNotification(QSocks5SocketEnginePrivate *this)

{
  QSocks5SocketEnginePrivate *in_RDI;
  char *unaff_retaddr;
  QSocks5SocketEngine *q;
  QSocks5SocketEnginePrivate *pQVar1;
  
  pQVar1 = in_RDI;
  q_func(in_RDI);
  in_RDI->connectionNotificationPending = true;
  QMetaObject::invokeMethod<>((QObject *)q,unaff_retaddr,(ConnectionType)((ulong)pQVar1 >> 0x20));
  return;
}

Assistant:

void QSocks5SocketEnginePrivate::emitConnectionNotification()
{
    Q_Q(QSocks5SocketEngine);
    QSOCKS5_D_DEBUG << "queueing connectionNotification";
    connectionNotificationPending = true;
    QMetaObject::invokeMethod(q, "_q_emitPendingConnectionNotification", Qt::QueuedConnection);
}